

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_tapfail.cpp
# Opt level: O1

void __thiscall tst_qpromise_tapfail::fulfilled_void(tst_qpromise_tapfail *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseResolver<void> PVar4;
  _func_int **pp_Var5;
  bool bVar6;
  char cVar7;
  int iVar8;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<void> *pPVar9;
  char *pcVar10;
  char *pcVar11;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_118;
  QPromise<void> p;
  QPromise<void> local_100;
  PromiseResolver<void> resolver_1;
  int value;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_e0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_c0 [2];
  QSharedData *local_b0;
  undefined **local_a8;
  PromiseDataBase<void,_void_()> *local_a0;
  PromiseResolver<void> resolver;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _func_int **local_38;
  
  value = -1;
  QtPromise::QPromise<void>::resolve();
  this_00 = local_a0;
  if (local_a0 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (local_a0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_a0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00127b48;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00127ad0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b0 = &this_01->super_QSharedData;
  local_38 = (_func_int **)&PTR__QPromiseBase_00127a68;
  local_e0.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00127a68;
  local_e0.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_e0);
  local_e0.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00127ab0;
  if ((PromiseDataBase<void,_void_()> *)local_e0.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_e0.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_e0.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_e0.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  local_58._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  ((long)local_58._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_00,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  local_78._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  ((long)local_78._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar6 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  if (!bVar6) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_00);
  }
  pQVar1 = &this_00->super_QSharedData;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127ab0;
  pPVar9 = (PromiseData<void> *)operator_new(0x58);
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00127b48;
  QReadWriteLock::QReadWriteLock(&(pPVar9->super_PromiseDataBase<void,_void_()>).m_lock,0);
  pp_Var5 = local_38;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00127ad0;
  LOCK();
  pQVar2 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar9 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_100.super_QPromiseBase<void>._vptr_QPromiseBase = local_38;
  p.super_QPromiseBase<void>.m_d.d = pPVar9;
  local_100.super_QPromiseBase<void>.m_d.d = pPVar9;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_100);
  local_100.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127ab0;
  if (local_100.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar2 = &((local_100.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_100.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_100.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_118 = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_c0[0] = resolver_1.m_d.d;
  local_e0.super__Function_base._M_functor._M_unused._M_object = (void *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_e0.super__Function_base._M_functor._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_e0._M_invoker = (_Invoker_type)this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_e0.super__Function_base._M_manager = (_Manager_type)pp_Var5;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_e0.super__Function_base._M_functor._M_unused._M_object;
  if ((Data *)local_e0.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_e0.super__Function_base._M_functor._M_unused._0_8_ =
         *local_e0.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise =
       (QPromise<void> *)local_e0.super__Function_base._M_functor._8_8_;
  if ((Data *)local_e0.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_e0.super__Function_base._M_functor._8_8_ =
         *(int *)local_e0.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00127ab0;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<void> *)local_e0._M_invoker;
  if ((PromiseDataBase<void,_void_()> *)local_e0._M_invoker != (PromiseDataBase<void,_void_()> *)0x0
     ) {
    LOCK();
    (((QSharedData *)((long)local_e0._M_invoker + 8))->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)((long)local_e0._M_invoker + 8))->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(_func_int ***)((long)resolver.m_d.d + 0x10) = pp_Var5;
  local_e0.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_00127ab0;
  if ((PromiseDataBase<void,_void_()> *)local_e0._M_invoker != (PromiseDataBase<void,_void_()> *)0x0
     ) {
    LOCK();
    pQVar2 = (QSharedData *)((long)local_e0._M_invoker + 8);
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_e0._M_invoker !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*(*(_func_int ***)local_e0._M_invoker)[1])();
    }
  }
  if ((Data *)local_e0.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_e0.super__Function_base._M_functor._8_8_ =
         *(int *)local_e0.super__Function_base._M_functor._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_e0.super__Function_base._M_functor._8_8_ == 0) &&
       ((Data *)local_e0.super__Function_base._M_functor._8_8_ != (Data *)0x0)) {
      operator_delete((void *)local_e0.super__Function_base._M_functor._8_8_,0x10);
    }
  }
  if ((Data *)local_e0.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_e0.super__Function_base._M_functor._M_unused._0_8_ =
         *local_e0.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_e0.super__Function_base._M_functor._M_unused._M_object == 0) &&
       ((Data *)local_e0.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0)) {
      operator_delete(local_e0.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_01,(function<void_()> *)&resolver);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_e0,(PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_118,
             (QPromiseResolve<void> *)local_c0,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher(this_01,&local_e0);
  if ((undefined **)local_e0.super__Function_base._M_manager != (undefined **)0x0) {
    (*local_e0.super__Function_base._M_manager)
              ((_Any_data *)&local_e0,(_Any_data *)&local_e0,__destroy_functor);
  }
  if (local_c0[0].d != (Data *)0x0) {
    LOCK();
    ((local_c0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_c0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_c0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_c0[0].d != (Data *)0x0)) {
      operator_delete(local_c0[0].d,0x10);
    }
  }
  if (local_118.d != (Data *)0x0) {
    LOCK();
    ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_118.d != (Data *)0x0)) {
      operator_delete(local_118.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = pp_Var5;
  bVar6 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar6) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (local_b0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_b0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_b0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  local_a8 = &PTR__QPromiseBase_00127ab0;
  if (local_a0 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &local_a0->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_a0 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*local_a0->_vptr_PromiseDataBase[1])();
    }
  }
  local_100.super_QPromiseBase<void>._vptr_QPromiseBase =
       (_func_int **)
       CONCAT44(local_100.super_QPromiseBase<void>._vptr_QPromiseBase._4_4_,0xffffffff);
  local_a8 = (undefined **)CONCAT44(local_a8._4_4_,0x2a);
  iVar8 = waitForValue<int>(&p,(int *)&local_100,(int *)&local_a8);
  cVar7 = QTest::qCompare(iVar8,0x2a,"waitForValue(p, -1, 42)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                          ,0x32);
  QVar3 = p.super_QPromiseBase<void>.m_d;
  if (cVar7 != '\0') {
    bVar6 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    bVar6 = (bool)(~bVar6 & ((QVar3.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                            _M_exception_object == (void *)0x0);
    local_100.super_QPromiseBase<void>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_100.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar6);
    local_a8 = (undefined **)CONCAT71(local_a8._1_7_,1);
    pcVar10 = QTest::toString<bool>((bool *)&local_100);
    pcVar11 = QTest::toString<bool>((bool *)&local_a8);
    cVar7 = QTest::compare_helper
                      (bVar6,"Compared values are not the same",pcVar10,pcVar11,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                       ,0x33);
    if (cVar7 != '\0') {
      QTest::qCompare(value,-1,"value","-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                      ,0x34);
    }
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127ab0;
  if (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_tapfail::fulfilled_void()
{
    int value = -1;
    auto p = QtPromise::QPromise<void>::resolve().tapFail([&]() {
        value = 43;
    });

    QCOMPARE(waitForValue(p, -1, 42), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, -1);
}